

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alg.cpp
# Opt level: O0

double __thiscall Alg::effic_inf_valid_algo(Alg *this)

{
  double dVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_28;
  Alg *local_10;
  Alg *this_local;
  
  local_10 = this;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_28,&this->__vecSeed);
  dVar1 = effic_inf_valid_algo(this,&local_28);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_28);
  return dVar1;
}

Assistant:

double Alg::effic_inf_valid_algo()
{
    return effic_inf_valid_algo(__vecSeed);
}